

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
std::
_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>_>
::_Tuple_impl(_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
              *this,_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                    *param_2)

{
  VTable *pVVar1;
  SharedPayloadBase *pSVar2;
  VTable *pVVar3;
  
  (this->super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>).
  super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bb000;
  pVVar1 = (param_2->
           super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>)
           .
           super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>
           ._M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.vtable_;
  (this->super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>).
  super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.vtable_ = pVVar1;
  pSVar2 = (param_2->
           super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>)
           .
           super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>
           ._M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.buffer_.
           shared;
  (this->super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>).
  super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.buffer_.shared =
       pSVar2;
  if ((pVVar1 != (VTable *)0x0) &&
     (pVVar1->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super__Tuple_impl<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>).
  super__Head_base<1UL,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bb530;
  (this->super__Head_base<0UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bafa8;
  pVVar3 = (param_2->super__Head_base<0UL,_testing::Matcher<int>,_false>)._M_head_impl.
           super_MatcherBase<int>.vtable_;
  (this->super__Head_base<0UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  vtable_ = pVVar3;
  pSVar2 = (param_2->super__Head_base<0UL,_testing::Matcher<int>,_false>)._M_head_impl.
           super_MatcherBase<int>.buffer_.shared;
  (this->super__Head_base<0UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  buffer_.shared = pSVar2;
  if ((pVVar3 != (VTable *)0x0) &&
     (pVVar3->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    (pSVar2->ref).super___atomic_base<int>._M_i = (pSVar2->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->super__Head_base<0UL,_testing::Matcher<int>,_false>)._M_head_impl.super_MatcherBase<int>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bb4e8;
  return;
}

Assistant:

MatcherBase(const MatcherBase& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    if (IsShared()) buffer_.shared->Ref();
  }